

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void addsub_sse4_1(__m128i in0,__m128i in1,__m128i *out0,__m128i *out1,__m128i *clamp_lo,
                  __m128i *clamp_hi)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 in_XMM0_Qa;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined8 in_XMM0_Qb;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_88;
  undefined4 uStack_84;
  __m128i a1;
  __m128i a0;
  __m128i *clamp_hi_local;
  __m128i *clamp_lo_local;
  __m128i *out1_local;
  __m128i *out0_local;
  __m128i in1_local;
  __m128i in0_local;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_b8 = (int)in_XMM0_Qa;
  uStack_b4 = (int)((ulong)in_XMM0_Qa >> 0x20);
  uStack_b0 = (int)in_XMM0_Qb;
  uStack_ac = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_c8 = (int)in_XMM1_Qa;
  uStack_c4 = (int)((ulong)in_XMM1_Qa >> 0x20);
  uStack_c0 = (int)in_XMM1_Qb;
  uStack_bc = (int)((ulong)in_XMM1_Qb >> 0x20);
  iVar1 = local_b8 + local_c8;
  iVar4 = uStack_b4 + uStack_c4;
  iVar7 = uStack_b0 + uStack_c0;
  iVar10 = uStack_ac + uStack_bc;
  local_b8 = local_b8 - local_c8;
  uStack_b4 = uStack_b4 - uStack_c4;
  uStack_b0 = uStack_b0 - uStack_c0;
  uStack_ac = uStack_ac - uStack_bc;
  a0[1]._0_4_ = (int)*(undefined8 *)in1[0];
  a0[1]._4_4_ = (int)((ulong)*(undefined8 *)in1[0] >> 0x20);
  clamp_hi_local._0_4_ = (int)*(undefined8 *)(in1[0] + 8);
  clamp_hi_local._4_4_ = (int)((ulong)*(undefined8 *)(in1[0] + 8) >> 0x20);
  uVar2 = (uint)(iVar1 < (int)a0[1]) * (int)a0[1] | (uint)(iVar1 >= (int)a0[1]) * iVar1;
  uVar5 = (uint)(iVar4 < a0[1]._4_4_) * a0[1]._4_4_ | (uint)(iVar4 >= a0[1]._4_4_) * iVar4;
  uVar8 = (uint)(iVar7 < (int)clamp_hi_local) * (int)clamp_hi_local |
          (uint)(iVar7 >= (int)clamp_hi_local) * iVar7;
  uVar11 = (uint)(iVar10 < clamp_hi_local._4_4_) * clamp_hi_local._4_4_ |
           (uint)(iVar10 >= clamp_hi_local._4_4_) * iVar10;
  in0_local[1]._0_4_ = (int)*(undefined8 *)in1[1];
  in0_local[1]._4_4_ = (int)((ulong)*(undefined8 *)in1[1] >> 0x20);
  uStack_20 = (int)*(undefined8 *)(in1[1] + 8);
  uStack_1c = (int)((ulong)*(undefined8 *)(in1[1] + 8) >> 0x20);
  uStack_88 = (int)*(undefined8 *)in1[0];
  uStack_84 = (int)((ulong)*(undefined8 *)in1[0] >> 0x20);
  a1[0]._0_4_ = (int)*(undefined8 *)(in1[0] + 8);
  a1[0]._4_4_ = (int)((ulong)*(undefined8 *)(in1[0] + 8) >> 0x20);
  uVar3 = (uint)(local_b8 < uStack_88) * uStack_88 | (uint)(local_b8 >= uStack_88) * local_b8;
  uVar6 = (uint)(uStack_b4 < uStack_84) * uStack_84 | (uint)(uStack_b4 >= uStack_84) * uStack_b4;
  uVar9 = (uint)(uStack_b0 < (int)a1[0]) * (int)a1[0] | (uint)(uStack_b0 >= (int)a1[0]) * uStack_b0;
  uVar12 = (uint)(uStack_ac < a1[0]._4_4_) * a1[0]._4_4_ |
           (uint)(uStack_ac >= a1[0]._4_4_) * uStack_ac;
  out0_local._0_4_ = (int)*(undefined8 *)in1[1];
  out0_local._4_4_ = (int)((ulong)*(undefined8 *)in1[1] >> 0x20);
  in1_local[0]._0_4_ = (int)*(undefined8 *)(in1[1] + 8);
  in1_local[0]._4_4_ = (int)((ulong)*(undefined8 *)(in1[1] + 8) >> 0x20);
  *(ulong *)in0[0] =
       CONCAT44((uint)(in0_local[1]._4_4_ < (int)uVar5) * in0_local[1]._4_4_ |
                (in0_local[1]._4_4_ >= (int)uVar5) * uVar5,
                (uint)((int)in0_local[1] < (int)uVar2) * (int)in0_local[1] |
                ((int)in0_local[1] >= (int)uVar2) * uVar2);
  *(ulong *)(in0[0] + 8) =
       CONCAT44((uint)(uStack_1c < (int)uVar11) * uStack_1c | (uStack_1c >= (int)uVar11) * uVar11,
                (uint)(uStack_20 < (int)uVar8) * uStack_20 | (uStack_20 >= (int)uVar8) * uVar8);
  *(ulong *)in0[1] =
       CONCAT44((uint)(out0_local._4_4_ < (int)uVar6) * out0_local._4_4_ |
                (out0_local._4_4_ >= (int)uVar6) * uVar6,
                (uint)((int)out0_local < (int)uVar3) * (int)out0_local |
                ((int)out0_local >= (int)uVar3) * uVar3);
  *(ulong *)(in0[1] + 8) =
       CONCAT44((uint)(in1_local[0]._4_4_ < (int)uVar12) * in1_local[0]._4_4_ |
                (in1_local[0]._4_4_ >= (int)uVar12) * uVar12,
                (uint)((int)in1_local[0] < (int)uVar9) * (int)in1_local[0] |
                ((int)in1_local[0] >= (int)uVar9) * uVar9);
  return;
}

Assistant:

static void addsub_sse4_1(const __m128i in0, const __m128i in1, __m128i *out0,
                          __m128i *out1, const __m128i *clamp_lo,
                          const __m128i *clamp_hi) {
  __m128i a0 = _mm_add_epi32(in0, in1);
  __m128i a1 = _mm_sub_epi32(in0, in1);

  a0 = _mm_max_epi32(a0, *clamp_lo);
  a0 = _mm_min_epi32(a0, *clamp_hi);
  a1 = _mm_max_epi32(a1, *clamp_lo);
  a1 = _mm_min_epi32(a1, *clamp_hi);

  *out0 = a0;
  *out1 = a1;
}